

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_rand_str(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int nLen;
  char zString [1024];
  
  if (nArg < 1) {
    nLen = 0x10;
  }
  else {
    iVar1 = jx9_value_to_int(*apArg);
    nLen = 0x10;
    if (0xfffffbff < iVar1 - 0x401U) {
      nLen = iVar1;
    }
  }
  jx9VmRandomString(pCtx->pVm,zString,nLen);
  jx9_result_string(pCtx,zString,nLen);
  return 0;
}

Assistant:

static int vm_builtin_rand_str(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	char zString[1024];
	int iLen = 0x10;
	if( nArg > 0 ){
		/* Get the desired length */
		iLen = jx9_value_to_int(apArg[0]);
		if( iLen < 1 || iLen > 1024 ){
			/* Default length */
			iLen = 0x10;
		}
	}
	/* Generate the random string */
	jx9VmRandomString(pCtx->pVm, zString, iLen);
	/* Return the generated string */
	jx9_result_string(pCtx, zString, iLen); /* Will make it's own copy */
	return SXRET_OK;
}